

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_cylinder(rf_vec3 position,float radius_top,float radius_bottom,float height,int sides,
                     rf_color color)

{
  _Bool _Var1;
  float fVar2;
  float fVar3;
  undefined8 local_60;
  rf_int i_3;
  rf_int i_2;
  rf_int i_1;
  rf_int i;
  undefined4 local_38;
  int num_vertex;
  int sides_local;
  float height_local;
  float radius_bottom_local;
  float radius_top_local;
  rf_color color_local;
  undefined4 local_14;
  undefined4 uStack_10;
  rf_vec3 position_local;
  
  local_38 = sides;
  if (sides < 3) {
    local_38 = 3;
  }
  _Var1 = rf_gfx_check_buffer_limit(local_38 * 6);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_push_matrix();
  local_14 = position.x;
  uStack_10 = position.y;
  rf_gfx_translatef(local_14,uStack_10,position.z);
  rf_gfx_begin(RF_TRIANGLES);
  radius_bottom_local._0_1_ = color.r;
  radius_bottom_local._1_1_ = color.g;
  radius_bottom_local._2_1_ = color.b;
  radius_bottom_local._3_1_ = color.a;
  rf_gfx_color4ub(radius_bottom_local._0_1_,radius_bottom_local._1_1_,radius_bottom_local._2_1_,
                  radius_bottom_local._3_1_);
  if (radius_top <= 0.0) {
    for (i_3 = 0; i_3 < 0x168; i_3 = (int)(0x168 / (long)local_38) + i_3) {
      rf_gfx_vertex3f(0.0,height,0.0);
      fVar2 = sinf((float)i_3 * 0.017453292);
      fVar3 = cosf((float)i_3 * 0.017453292);
      rf_gfx_vertex3f(fVar2 * radius_bottom,0.0,fVar3 * radius_bottom);
      fVar2 = sinf((float)(i_3 + (int)(0x168 / (long)local_38)) * 0.017453292);
      fVar3 = cosf((float)(i_3 + (int)(0x168 / (long)local_38)) * 0.017453292);
      rf_gfx_vertex3f(fVar2 * radius_bottom,0.0,fVar3 * radius_bottom);
    }
  }
  else {
    for (i_1 = 0; i_1 < 0x168; i_1 = (int)(0x168 / (long)local_38) + i_1) {
      fVar2 = sinf((float)i_1 * 0.017453292);
      fVar3 = cosf((float)i_1 * 0.017453292);
      rf_gfx_vertex3f(fVar2 * radius_bottom,0.0,fVar3 * radius_bottom);
      fVar2 = sinf((float)(i_1 + (int)(0x168 / (long)local_38)) * 0.017453292);
      fVar3 = cosf((float)(i_1 + (int)(0x168 / (long)local_38)) * 0.017453292);
      rf_gfx_vertex3f(fVar2 * radius_bottom,0.0,fVar3 * radius_bottom);
      fVar2 = sinf((float)(i_1 + (int)(0x168 / (long)local_38)) * 0.017453292);
      fVar3 = cosf((float)(i_1 + (int)(0x168 / (long)local_38)) * 0.017453292);
      rf_gfx_vertex3f(fVar2 * radius_top,height,fVar3 * radius_top);
      fVar2 = sinf((float)i_1 * 0.017453292);
      fVar3 = cosf((float)i_1 * 0.017453292);
      rf_gfx_vertex3f(fVar2 * radius_top,height,fVar3 * radius_top);
      fVar2 = sinf((float)i_1 * 0.017453292);
      fVar3 = cosf((float)i_1 * 0.017453292);
      rf_gfx_vertex3f(fVar2 * radius_bottom,0.0,fVar3 * radius_bottom);
      fVar2 = sinf((float)(i_1 + (int)(0x168 / (long)local_38)) * 0.017453292);
      fVar3 = cosf((float)(i_1 + (int)(0x168 / (long)local_38)) * 0.017453292);
      rf_gfx_vertex3f(fVar2 * radius_top,height,fVar3 * radius_top);
    }
    for (i_2 = 0; i_2 < 0x168; i_2 = (int)(0x168 / (long)local_38) + i_2) {
      rf_gfx_vertex3f(0.0,height,0.0);
      fVar2 = sinf((float)i_2 * 0.017453292);
      fVar3 = cosf((float)i_2 * 0.017453292);
      rf_gfx_vertex3f(fVar2 * radius_top,height,fVar3 * radius_top);
      fVar2 = sinf((float)(i_2 + (int)(0x168 / (long)local_38)) * 0.017453292);
      fVar3 = cosf((float)(i_2 + (int)(0x168 / (long)local_38)) * 0.017453292);
      rf_gfx_vertex3f(fVar2 * radius_top,height,fVar3 * radius_top);
    }
  }
  for (local_60 = 0; local_60 < 0x168; local_60 = (int)(0x168 / (long)local_38) + local_60) {
    rf_gfx_vertex3f(0.0,0.0,0.0);
    fVar2 = sinf((float)(local_60 + (int)(0x168 / (long)local_38)) * 0.017453292);
    fVar3 = cosf((float)(local_60 + (int)(0x168 / (long)local_38)) * 0.017453292);
    rf_gfx_vertex3f(fVar2 * radius_bottom,0.0,fVar3 * radius_bottom);
    fVar2 = sinf((float)local_60 * 0.017453292);
    fVar3 = cosf((float)local_60 * 0.017453292);
    rf_gfx_vertex3f(fVar2 * radius_bottom,0.0,fVar3 * radius_bottom);
  }
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_cylinder(rf_vec3 position, float radius_top, float radius_bottom, float height, int sides, rf_color color)
{
    if (sides < 3) sides = 3;

    int num_vertex = sides*6;
    if (rf_gfx_check_buffer_limit(num_vertex)) rf_gfx_draw();

    rf_gfx_push_matrix();
    rf_gfx_translatef(position.x, position.y, position.z);

    rf_gfx_begin(RF_TRIANGLES);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);

    if (radius_top > 0)
    {
        // Draw Body -------------------------------------------------------------------------------------
        for (rf_int i = 0; i < 360; i += 360 / sides)
        {
            rf_gfx_vertex3f(sinf(RF_DEG2RAD * i) * radius_bottom, 0, cosf(RF_DEG2RAD * i) * radius_bottom);                                   // Bottom Left
            rf_gfx_vertex3f(sinf(RF_DEG2RAD * (i + 360 / sides)) * radius_bottom, 0,   cosf(RF_DEG2RAD * (i + 360 / sides)) * radius_bottom); // Bottom Right
            rf_gfx_vertex3f(sinf(RF_DEG2RAD * (i + 360 / sides)) * radius_top, height, cosf(RF_DEG2RAD * (i + 360 / sides)) * radius_top);    // Top Right

            rf_gfx_vertex3f(sinf(RF_DEG2RAD * i) * radius_top, height, cosf(RF_DEG2RAD * i) * radius_top);                                 // Top Left
            rf_gfx_vertex3f(sinf(RF_DEG2RAD * i) * radius_bottom, 0,   cosf(RF_DEG2RAD * i) * radius_bottom);                              // Bottom Left
            rf_gfx_vertex3f(sinf(RF_DEG2RAD * (i + 360 / sides)) * radius_top, height, cosf(RF_DEG2RAD * (i + 360 / sides)) * radius_top); // Top Right
        }

        // Draw Cap --------------------------------------------------------------------------------------
        for (rf_int i = 0; i < 360; i += 360/sides)
        {
            rf_gfx_vertex3f(0, height, 0);
            rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius_top, height, cosf(RF_DEG2RAD*i)*radius_top);
            rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 360/sides))*radius_top, height, cosf(RF_DEG2RAD*(i + 360/sides))*radius_top);
        }
    }
    else
    {
        // Draw Cone -------------------------------------------------------------------------------------
        for (rf_int i = 0; i < 360; i += 360/sides)
        {
            rf_gfx_vertex3f(0, height, 0);
            rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius_bottom, 0, cosf(RF_DEG2RAD*i)*radius_bottom);
            rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 360/sides))*radius_bottom, 0, cosf(RF_DEG2RAD*(i + 360/sides))*radius_bottom);
        }
    }

    // Draw Base -----------------------------------------------------------------------------------------
    for (rf_int i = 0; i < 360; i += 360/sides)
    {
        rf_gfx_vertex3f(0, 0, 0);
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 360/sides))*radius_bottom, 0, cosf(RF_DEG2RAD*(i + 360/sides))*radius_bottom);
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius_bottom, 0, cosf(RF_DEG2RAD*i)*radius_bottom);
    }

    rf_gfx_end();
    rf_gfx_pop_matrix();
}